

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_certificate.cc
# Opt level: O0

bool __thiscall
bssl::ParseCrlDistributionPoints
          (bssl *this,Input extension_value,
          vector<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
          *distribution_points)

{
  Input input;
  bool bVar1;
  undefined1 local_68 [8];
  Parser distribution_points_parser;
  undefined1 local_40 [8];
  Parser extension_value_parser;
  vector<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
  *distribution_points_local;
  Input extension_value_local;
  
  extension_value_parser.advance_len_ = extension_value.data_.size_;
  ::std::vector<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>::
  clear((vector<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_> *)
        extension_value_parser.advance_len_);
  input.data_.size_ = (size_t)extension_value.data_.data_;
  input.data_.data_ = (uchar *)this;
  distribution_points_parser.advance_len_ = (size_t)this;
  der::Parser::Parser((Parser *)local_40,input);
  der::Parser::Parser((Parser *)local_68);
  bVar1 = der::Parser::ReadSequence((Parser *)local_40,(Parser *)local_68);
  if (((bVar1) && (bVar1 = der::Parser::HasMore((Parser *)local_40), !bVar1)) &&
     (bVar1 = der::Parser::HasMore((Parser *)local_68), bVar1)) {
    do {
      bVar1 = der::Parser::HasMore((Parser *)local_68);
      if (!bVar1) {
        return true;
      }
      bVar1 = anon_unknown_0::ParseAndAddDistributionPoint
                        ((Parser *)local_68,
                         (vector<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
                          *)extension_value_parser.advance_len_);
    } while (bVar1);
  }
  return false;
}

Assistant:

bool ParseCrlDistributionPoints(
    der::Input extension_value,
    std::vector<ParsedDistributionPoint> *distribution_points) {
  distribution_points->clear();

  // RFC 5280, section 4.2.1.13.
  //
  // CRLDistributionPoints ::= SEQUENCE SIZE (1..MAX) OF DistributionPoint
  der::Parser extension_value_parser(extension_value);
  der::Parser distribution_points_parser;
  if (!extension_value_parser.ReadSequence(&distribution_points_parser)) {
    return false;
  }
  if (extension_value_parser.HasMore()) {
    return false;
  }

  // Sequence must have a minimum of 1 item.
  if (!distribution_points_parser.HasMore()) {
    return false;
  }

  while (distribution_points_parser.HasMore()) {
    if (!ParseAndAddDistributionPoint(&distribution_points_parser,
                                      distribution_points)) {
      return false;
    }
  }

  return true;
}